

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O2

char __thiscall TidyConfigParser::peekChar(TidyConfigParser *this)

{
  char cVar1;
  int iVar2;
  
  do {
    iVar2 = std::istream::peek();
    if (iVar2 != 0x20) {
      iVar2 = std::istream::peek();
      if (iVar2 != 9) {
        if (((&this->field_0x80)[*(long *)(*(long *)&this->fileStream + -0x18)] & 2) == 0) {
          cVar1 = std::istream::peek();
        }
        else {
          cVar1 = '\0';
        }
        return cVar1;
      }
    }
    std::istream::get();
  } while( true );
}

Assistant:

inline char TidyConfigParser::peekChar() {
    while (fileStream.peek() == ' ' || fileStream.peek() == '\t') {
        fileStream.get();
    }
    if (fileStream.eof())
        return 0;
#if defined(_WIN32)
    char ret = fileStream.peek();
    if (ret == '\r') {
        fileStream.get();
        if (fileStream.peek() == '\n') {
            ret = '\n';
        }
        fileStream.unget();
    }
    return ret;
#elif defined(_MACOS)
    char ret = fileStream.peek();
    if (ret == '\r')
        ret = '\n';
    return ret;
#else
    return static_cast<char>(fileStream.peek());
#endif
}